

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jsoncons::
value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::convert(value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *this,long value,semantic_tag param_3,error_code *param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000118;
  long in_stack_00000120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator<char> local_2a;
  undefined1 local_29;
  
  local_29 = 0;
  pbVar1 = in_RDI;
  value_converter_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get_allocator((value_converter_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_RDI);
  std::__cxx11::string::string((string *)in_RDI,(allocator *)&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  detail::from_integer<long,std::__cxx11::string>(in_stack_00000120,in_stack_00000118);
  return pbVar1;
}

Assistant:

Into convert(From value, semantic_tag, std::error_code&)
        {
            Into s(this->get_allocator());
            jsoncons::detail::from_integer(value, s);
            return s;
        }